

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O0

void __thiscall Js::SCAPropBag::SCAPropBag(SCAPropBag *this,ScriptContext *scriptContext)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  TrackAllocData local_58;
  Recycler *local_20;
  Recycler *recycler;
  ScriptContext *scriptContext_local;
  SCAPropBag *this_local;
  
  recycler = (Recycler *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  ScriptContextHolder::ScriptContextHolder(&this->super_ScriptContextHolder,scriptContext);
  IUnknown::IUnknown(&this->super_IUnknown);
  (this->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_01e51178;
  Memory::
  RecyclerRootPtr<JsUtil::BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>_>
  ::RecyclerRootPtr(&this->m_properties);
  this->m_refCount = 1;
  this_00 = ScriptContextHolder::GetScriptContext(&this->super_ScriptContextHolder);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  local_20 = pRVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &JsUtil::
              BaseDictionary<Js::InternalString,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCAPropBag.cpp"
             ,0x1b);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  this_01 = (BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar1,0x43c4b0);
  JsUtil::
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_01,local_20,0);
  Memory::
  RecyclerRootPtr<JsUtil::BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>_>
  ::Root(&this->m_properties,this_01,local_20);
  return;
}

Assistant:

SCAPropBag::SCAPropBag(ScriptContext* scriptContext)
        : ScriptContextHolder(scriptContext), m_refCount(1)
    {
        Recycler* recycler = GetScriptContext()->GetRecycler();
        m_properties.Root(RecyclerNew(recycler, PropertyDictionary, recycler), recycler);        
    }